

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_nodeid_mod_check
                 (lysc_ctx *ctx,char *str,ly_bool abs,ly_set *mod_set,lysc_nodeid **nodeid,
                 lys_module **target_mod)

{
  uint uVar1;
  lysc_nodeid *plVar2;
  LY_ERR LVar3;
  size_t expr_len;
  lys_module *object;
  char *format;
  undefined7 in_register_00000011;
  int iVar4;
  ulong uVar5;
  lys_module *plVar6;
  uint uVar7;
  ly_ctx *plVar8;
  char *pcVar9;
  char *pcVar10;
  lysc_nodeid *ni;
  lys_module **local_50;
  lyxp_expr *e;
  lysc_nodeid **local_40;
  ly_set *local_38;
  
  uVar5 = 0;
  e = (lyxp_expr *)0x0;
  ni = (lysc_nodeid *)0x0;
  pcVar10 = "descendant-schema-nodeid";
  if ((int)CONCAT71(in_register_00000011,abs) != 0) {
    pcVar10 = "absolute-schema-nodeid";
  }
  plVar8 = ctx->ctx;
  local_50 = target_mod;
  local_40 = nodeid;
  local_38 = mod_set;
  expr_len = strlen(str);
  LVar3 = lyxp_expr_parse(plVar8,str,expr_len,'\0',&e);
  if (LVar3 == LY_SUCCESS) {
    if ((abs == '\0') && (uVar5 = 1, *e->tokens != LYXP_TOKEN_NAMETEST)) {
      plVar8 = ctx->ctx;
      uVar1 = *e->tok_len;
      pcVar9 = e->expr + *e->tok_pos;
      format = "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".";
      pcVar10 = "descendant-schema-nodeid";
LAB_0014d245:
      ly_vlog(plVar8,(char *)0x0,LYVE_REFERENCE,format,pcVar10,str,(ulong)uVar1,pcVar9);
LAB_0014d254:
      LVar3 = LY_EVALID;
    }
    else {
      uVar1 = e->used;
      if ((uint)uVar5 < uVar1) {
        do {
          if (e->tokens[uVar5] != LYXP_TOKEN_OPER_PATH) {
            plVar8 = ctx->ctx;
            uVar1 = e->tok_len[uVar5];
            pcVar9 = e->expr + e->tok_pos[uVar5];
            format = "Invalid %s value \"%s\" - \"/\" expected instead of \"%.*s\".";
            goto LAB_0014d245;
          }
          iVar4 = (int)uVar5;
          if (uVar1 - 1 == iVar4) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                    "Invalid %s value \"%s\" - unexpected end of expression.",pcVar10,e->expr);
            goto LAB_0014d254;
          }
          uVar7 = iVar4 + 1;
          if (e->tokens[uVar7] != LYXP_TOKEN_NAMETEST) {
            plVar8 = ctx->ctx;
            uVar1 = e->tok_len[uVar7];
            pcVar9 = e->expr + e->tok_pos[uVar7];
            format = "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".";
            goto LAB_0014d245;
          }
          uVar5 = (ulong)(iVar4 + 2U);
        } while (iVar4 + 2U < uVar1);
      }
      if (abs == '\0' && local_40 == (lysc_nodeid **)0x0) {
        plVar6 = (lys_module *)0x0;
      }
      else {
        LVar3 = lys_precompile_nodeid(ctx->ctx,str,&ni);
        plVar2 = ni;
        if (LVar3 != LY_SUCCESS) goto LAB_0014d259;
        if ((abs == '\0') || (ni->count == 0)) {
          plVar6 = (lys_module *)0x0;
        }
        else {
          uVar5 = 0;
          plVar6 = (lys_module *)0x0;
          do {
            object = lys_schema_node_get_module(ctx->ctx,plVar2->prefix[uVar5],ctx->pmod);
            if (object == (lys_module *)0x0) goto LAB_0014d254;
            LVar3 = ly_set_add(local_38,object,'\0',(uint32_t *)0x0);
            if (LVar3 != LY_SUCCESS) goto LAB_0014d259;
            if (plVar6 == (lys_module *)0x0) {
              plVar6 = object;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < plVar2->count);
        }
        if (local_40 != (lysc_nodeid **)0x0) {
          *local_40 = ni;
          ni = (lysc_nodeid *)0x0;
        }
      }
      LVar3 = LY_SUCCESS;
      if (local_50 != (lys_module **)0x0) {
        *local_50 = plVar6;
      }
    }
  }
  else {
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid %s value \"%s\" - invalid syntax.",
            pcVar10,str);
    LVar3 = LY_EVALID;
  }
LAB_0014d259:
  lyxp_expr_free(ctx->ctx,e);
  lysc_nodeid_free(ctx->ctx,ni);
  return LVar3;
}

Assistant:

static LY_ERR
lys_nodeid_mod_check(struct lysc_ctx *ctx, const char *str, ly_bool abs, struct ly_set *mod_set,
        struct lysc_nodeid **nodeid, struct lys_module **target_mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *e = NULL;
    struct lysc_nodeid *ni = NULL;
    struct lys_module *tmod = NULL, *mod;
    const char *nodeid_type = abs ? "absolute-schema-nodeid" : "descendant-schema-nodeid";
    uint32_t i;

    /* parse */
    ret = lyxp_expr_parse(ctx->ctx, str, strlen(str), 0, &e);
    if (ret) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "Invalid %s value \"%s\" - invalid syntax.", nodeid_type, str);
        ret = LY_EVALID;
        goto cleanup;
    }

    if (abs) {
        /* absolute schema nodeid */
        i = 0;
    } else {
        /* descendant schema nodeid */
        if (e->tokens[0] != LYXP_TOKEN_NAMETEST) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[0], e->expr + e->tok_pos[0]);
            ret = LY_EVALID;
            goto cleanup;
        }
        i = 1;
    }

    /* check all the tokens */
    for ( ; i < e->used; i += 2) {
        if (e->tokens[i] != LYXP_TOKEN_OPER_PATH) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - \"/\" expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[i], e->expr + e->tok_pos[i]);
            ret = LY_EVALID;
            goto cleanup;
        } else if (e->used == i + 1) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid %s value \"%s\" - unexpected end of expression.", nodeid_type, e->expr);
            ret = LY_EVALID;
            goto cleanup;
        } else if (e->tokens[i + 1] != LYXP_TOKEN_NAMETEST) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid %s value \"%s\" - name test expected instead of \"%.*s\".",
                    nodeid_type, str, (int)e->tok_len[i + 1], e->expr + e->tok_pos[i + 1]);
            ret = LY_EVALID;
            goto cleanup;
        }
    }

    if (abs || nodeid) {
        /* compile into nodeid, only if needed */
        LY_CHECK_GOTO(ret = lys_precompile_nodeid(ctx->ctx, str, &ni), cleanup);
    }

    if (abs) {
        for (i = 0; i < ni->count; ++i) {
            mod = (struct lys_module *)lys_schema_node_get_module(ctx->ctx, ni->prefix[i], ctx->pmod);
            LY_CHECK_ERR_GOTO(!mod, ret = LY_EVALID, cleanup);

            /* only keep the first module */
            if (!tmod) {
                tmod = mod;
            }

            /* store the referenced module */
            LY_CHECK_GOTO(ret = ly_set_add(mod_set, mod, 0, NULL), cleanup);
        }
    }

    if (nodeid) {
        *nodeid = ni;
        ni = NULL;
    }
    if (target_mod) {
        *target_mod = tmod;
    }

cleanup:
    lyxp_expr_free(ctx->ctx, e);
    lysc_nodeid_free(ctx->ctx, ni);
    return ret;
}